

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testError.cpp
# Opt level: O1

void anon_unknown.dwarf_b841::testNormalizedRounding(int n)

{
  ushort uVar1;
  uint uVar2;
  ostream *poVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float local_54;
  float local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"rounding normalized numbers to ",0x1f);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,n);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-bit precision\n",0xf);
  local_54 = 0.0;
  if (n < 10) {
    local_54 = (float)(double)(((ulong)(10 - n) << 0x34) + 0x3f3ffffaa19c4774);
  }
  iVar6 = 200000;
  uVar5 = 0;
  local_48 = 0.0;
  do {
    fVar9 = drand();
    fVar9 = fVar9 * 65504.0;
    if ((fVar9 != 0.0) || (NAN(fVar9))) {
      uVar1 = *(ushort *)((long)&half::_eLut + (ulong)((uint)fVar9 >> 0x17) * 2);
      if (uVar1 == 0) {
        uVar2 = half::convert((int)fVar9);
      }
      else {
        uVar2 = (uint)uVar1 +
                (((uint)fVar9 & 0x7fffff) + 0xfff + (uint)(((uint)fVar9 >> 0xd & 1) != 0) >> 0xd);
      }
    }
    else {
      uVar2 = (uint)fVar9 >> 0x10;
    }
    fVar9 = local_48;
    if (6.1035156e-05 <= *(float *)((long)&half::_toFloat + (ulong)(ushort)uVar2 * 4)) {
      uVar7 = uVar2 ^ uVar5;
      uVar8 = uVar7;
      if ((uint)n < 10) {
        bVar4 = (byte)(9U - n);
        uVar2 = ((uVar2 & 0x7fff) >> (bVar4 & 0x1f)) +
                (uint)(((uVar2 & 0x7fff) >> (9U - n & 0x1f) & 1) != 0) << (bVar4 & 0x1f);
        uVar8 = uVar7 & -1 << (10U - (char)n & 0x1f);
        if ((uVar2 & 0xfc00) < 0x7c00) {
          uVar8 = uVar2;
        }
        uVar8 = uVar8 | uVar7 & 0xffff8000;
      }
      fVar10 = 1.0 - *(float *)((long)&half::_toFloat + (ulong)(uVar8 & 0xffff) * 4) /
                     *(float *)((long)&half::_toFloat + (ulong)(uVar7 & 0xffff) * 4);
      fVar9 = -fVar10;
      if (-fVar10 <= fVar10) {
        fVar9 = fVar10;
      }
      if (local_54 < fVar9) {
        poVar3 = std::operator<<((ostream *)&std::cout,"half = ");
        poVar3 = (ostream *)operator<<(poVar3,(half)(unsigned_short)uVar7);
        poVar3 = std::operator<<(poVar3,", rounded = ");
        poVar3 = (ostream *)operator<<(poVar3,(half)(unsigned_short)uVar8);
        poVar3 = std::operator<<(poVar3,", error = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar9);
        poVar3 = std::operator<<(poVar3,", expected error = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_54);
        std::endl<char,std::char_traits<char>>(poVar3);
        printBits((ostream *)&std::cout,(half)(unsigned_short)uVar7);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        printBits((ostream *)&std::cout,(half)(unsigned_short)uVar8);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/HalfTest/testError.cpp"
                      ,0x98,"void (anonymous namespace)::testNormalizedRounding(int)");
      }
      if (fVar9 <= local_48) {
        fVar9 = local_48;
      }
    }
    local_48 = fVar9;
    uVar5 = uVar5 - 0x8000;
    iVar6 = iVar6 + -1;
    if (iVar6 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"max error          = ",0x15);
      poVar3 = std::ostream::_M_insert<double>((double)local_48);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"max expected error = ",0x15);
      poVar3 = std::ostream::_M_insert<double>((double)local_54);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n\n",4);
      std::ostream::flush();
      return;
    }
  } while( true );
}

Assistant:

void
testNormalizedRounding (int n)
{
    cout << "rounding normalized numbers to " << n << "-bit precision\n";

    float eExpected = (n < 10)? HALF_EPSILON * 0.5f * (1 << (10 - n)): 0;
    float eMax = 0;

    for (int i = 0; i < 200000; i++)
    {
	half h (drand() * HALF_MAX);

	if (h < HALF_NRM_MIN)
	    continue;

	if (i & 1)
	    h = -h;

	half r (h.round(n));
	float e = 1.0f - r/h;

	if (e < 0)
	    e = -e;

	if (e > eExpected)
	{
	    cout << "half = " << h <<
		    ", rounded = " << r <<
		    ", error = " << e <<
		    ", expected error = " << eExpected << endl;

	    printBits (cout, h);
	    cout << endl;
	    printBits (cout, r);
	    cout << endl;

	    assert (false);
	}

	if (e > eMax)
	    eMax = e;
    }

    cout << "max error          = " << eMax << endl;
    cout << "max expected error = " << eExpected << endl;
    cout << "ok\n\n" << flush;
}